

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChDirectSolverLS.cpp
# Opt level: O3

void __thiscall chrono::ChDirectSolverLS::ChDirectSolverLS(ChDirectSolverLS *this)

{
  undefined1 auVar1 [16];
  
  (this->super_ChSolverLS).super_ChSolver.verbose = false;
  (this->super_ChSolverLS).super_ChSolver.output_dir._M_dataplus._M_p =
       (pointer)&(this->super_ChSolverLS).super_ChSolver.output_dir.field_2;
  (this->super_ChSolverLS).super_ChSolver.output_dir._M_string_length = 0;
  (this->super_ChSolverLS).super_ChSolver.output_dir.field_2._M_local_buf[0] = '\0';
  (this->super_ChSolverLS).super_ChSolver.frame_id._M_dataplus._M_p =
       (pointer)&(this->super_ChSolverLS).super_ChSolver.frame_id.field_2;
  (this->super_ChSolverLS).super_ChSolver.frame_id._M_string_length = 0;
  (this->super_ChSolverLS).super_ChSolver.frame_id.field_2._M_local_buf[0] = '\0';
  (this->super_ChSolverLS).super_ChSolver._vptr_ChSolver =
       (_func_int **)&PTR__ChDirectSolverLS_00b39830;
  (this->m_mat).super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.m_isRValue = false;
  (this->m_mat)._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b0c488;
  (this->m_mat).m_outerSize = -1;
  (this->m_mat).m_innerSize = 0;
  (this->m_mat).m_outerIndex = (StorageIndex *)0x0;
  (this->m_mat).m_innerNonZeros = (StorageIndex *)0x0;
  (this->m_mat).m_data.m_values = (Scalar *)0x0;
  (this->m_mat).m_data.m_values = (Scalar *)0x0;
  (this->m_mat).m_data.m_indices = (StorageIndex *)0x0;
  (this->m_mat).m_data.m_size = 0;
  (this->m_mat).m_data.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_1,_int>::resize(&this->m_mat,0,0);
  this->m_dim = 0;
  this->m_symmetry = GENERAL;
  this->m_sparsity = -1.0;
  (this->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->m_sol).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->m_sol).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  *(undefined8 *)
   ((long)&(this->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows + 1) = 0;
  *(undefined8 *)
   ((long)&(this->m_sol).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data + 1) = 0;
  *(undefined8 *)
   ((long)&(this->m_sol).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows + 1) = 0;
  *(undefined8 *)((long)&this->m_solve_call + 1) = 0;
  auVar1 = ZEXT416(0) << 0x40;
  this->m_use_learner = true;
  this->m_force_update = true;
  this->m_use_perm = false;
  this->m_use_rhs_sparsity = false;
  this->m_null_pivot_detection = false;
  (this->m_timer_setup_assembly).m_start = (time_point)auVar1._0_8_;
  (this->m_timer_setup_assembly).m_end = (time_point)auVar1._8_8_;
  (this->m_timer_setup_solvercall).m_start = (time_point)auVar1._0_8_;
  (this->m_timer_setup_solvercall).m_end = (time_point)auVar1._8_8_;
  (this->m_timer_solve_assembly).m_start = (time_point)auVar1._0_8_;
  (this->m_timer_solve_assembly).m_end = (time_point)auVar1._8_8_;
  (this->m_timer_solve_solvercall).m_start = (time_point)auVar1._0_8_;
  (this->m_timer_solve_solvercall).m_end = (time_point)auVar1._8_8_;
  return;
}

Assistant:

ChDirectSolverLS::ChDirectSolverLS()
    : m_lock(false),
      m_use_learner(true),
      m_force_update(true),
      m_null_pivot_detection(false),
      m_use_rhs_sparsity(false),
      m_use_perm(false),
      m_symmetry(MatrixSymmetryType::GENERAL),
      m_dim(0),
      m_sparsity(-1),
      m_solve_call(0),
      m_setup_call(0) {}